

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

void __thiscall
capnp::compiler::Declaration::Param::DefaultValue::Builder::adoptValue
          (Builder *this,Orphan<capnp::compiler::Expression> *value)

{
  PointerBuilder builder;
  uint uVar1;
  Orphan<capnp::compiler::Expression> *value_00;
  PointerBuilder local_30;
  Orphan<capnp::compiler::Expression> *local_18;
  Orphan<capnp::compiler::Expression> *value_local;
  Builder *this_local;
  
  local_18 = value;
  value_local = (Orphan<capnp::compiler::Expression> *)this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Declaration::Param::DefaultValue::Which>
            (&this->_builder,uVar1,VALUE);
  uVar1 = bounded<3u>();
  capnp::_::StructBuilder::getPointerField(&local_30,&this->_builder,uVar1);
  value_00 = kj::mv<capnp::Orphan<capnp::compiler::Expression>>(local_18);
  builder.capTable = local_30.capTable;
  builder.segment = local_30.segment;
  builder.pointer = local_30.pointer;
  capnp::_::PointerHelpers<capnp::compiler::Expression,_(capnp::Kind)3>::adopt(builder,value_00);
  return;
}

Assistant:

inline void Declaration::Param::DefaultValue::Builder::adoptValue(
    ::capnp::Orphan< ::capnp::compiler::Expression>&& value) {
  _builder.setDataField<Declaration::Param::DefaultValue::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Declaration::Param::DefaultValue::VALUE);
  ::capnp::_::PointerHelpers< ::capnp::compiler::Expression>::adopt(_builder.getPointerField(
      ::capnp::bounded<3>() * ::capnp::POINTERS), kj::mv(value));
}